

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

bool __thiscall
ImFontAtlas::GetMouseCursorTexData
          (ImFontAtlas *this,ImGuiMouseCursor cursor_type,ImVec2 *out_offset,ImVec2 *out_size,
          ImVec2 *out_uv_border,ImVec2 *out_uv_fill)

{
  float fVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  ImVec2 IVar4;
  ImVec2 IVar5;
  bool bVar6;
  ImFontAtlasCustomRect *pIVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  if (((uint)cursor_type < 9) && ((this->Flags & 2) == 0)) {
    if (this->PackIdMouseCursors == -1) {
      __assert_fail("PackIdMouseCursors != -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui_draw.cpp"
                    ,0x8ce,
                    "bool ImFontAtlas::GetMouseCursorTexData(ImGuiMouseCursor, ImVec2 *, ImVec2 *, ImVec2 *, ImVec2 *)"
                   );
    }
    pIVar7 = GetCustomRectByIndex(this,this->PackIdMouseCursors);
    fVar8 = (float)pIVar7->X + FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[(uint)cursor_type][0].x;
    fVar9 = (float)pIVar7->Y + FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[(uint)cursor_type][0].y;
    fVar1 = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[(uint)cursor_type][1].x;
    IVar2 = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[(uint)cursor_type][2];
    *out_size = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[(uint)cursor_type][1];
    *out_offset = IVar2;
    IVar3.y = (this->TexUvScale).y * fVar9;
    IVar3.x = (this->TexUvScale).x * fVar8;
    *out_uv_border = IVar3;
    fVar10 = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[(uint)cursor_type][1].y + fVar9;
    IVar4.y = (this->TexUvScale).y * fVar10;
    IVar4.x = (fVar8 + fVar1) * (this->TexUvScale).x;
    out_uv_border[1] = IVar4;
    IVar5.y = fVar9 * (this->TexUvScale).y;
    IVar5.x = (this->TexUvScale).x * (fVar8 + 123.0);
    *out_uv_fill = IVar5;
    IVar2.y = fVar10 * (this->TexUvScale).y;
    IVar2.x = (fVar8 + 123.0 + fVar1) * (this->TexUvScale).x;
    out_uv_fill[1] = IVar2;
    bVar6 = true;
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool ImFontAtlas::GetMouseCursorTexData(ImGuiMouseCursor cursor_type, ImVec2* out_offset, ImVec2* out_size, ImVec2 out_uv_border[2], ImVec2 out_uv_fill[2])
{
    if (cursor_type <= ImGuiMouseCursor_None || cursor_type >= ImGuiMouseCursor_COUNT)
        return false;
    if (Flags & ImFontAtlasFlags_NoMouseCursors)
        return false;

    IM_ASSERT(PackIdMouseCursors != -1);
    ImFontAtlasCustomRect* r = GetCustomRectByIndex(PackIdMouseCursors);
    ImVec2 pos = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[cursor_type][0] + ImVec2((float)r->X, (float)r->Y);
    ImVec2 size = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[cursor_type][1];
    *out_size = size;
    *out_offset = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[cursor_type][2];
    out_uv_border[0] = (pos) * TexUvScale;
    out_uv_border[1] = (pos + size) * TexUvScale;
    pos.x += FONT_ATLAS_DEFAULT_TEX_DATA_W + 1;
    out_uv_fill[0] = (pos) * TexUvScale;
    out_uv_fill[1] = (pos + size) * TexUvScale;
    return true;
}